

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSFieldDefault_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  FieldDescriptor *field_00;
  bool bVar1;
  CppType CVar2;
  uint32 uVar3;
  uint uVar4;
  Type TVar5;
  protobuf *ppVar6;
  EnumValueDescriptor *this_00;
  char *pcVar7;
  string *psVar8;
  LogMessage *pLVar9;
  int i;
  int i_00;
  int i_01;
  long i_02;
  long i_03;
  float value;
  double value_00;
  allocator local_1c2;
  LogFinisher local_1c1;
  LogMessage local_1c0;
  allocator local_181;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  LogFinisher local_119;
  LogMessage local_118;
  undefined1 local_d9;
  undefined1 local_d8 [7];
  bool is_valid;
  string out;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  allocator local_19;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  
  local_18 = (FieldDescriptor *)this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)this);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"[]",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    CVar2 = FieldDescriptor::cpp_type(local_18);
    field_00 = local_18;
    switch(CVar2) {
    case CPPTYPE_INT32:
      uVar4 = FieldDescriptor::default_value_int32(local_18);
      SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)uVar4,i);
      anon_unknown_0::MaybeNumberString(__return_storage_ptr__,field_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      break;
    case CPPTYPE_INT64:
      ppVar6 = (protobuf *)FieldDescriptor::default_value_int64(local_18);
      SimpleItoa_abi_cxx11_(&local_90,ppVar6,i_02);
      anon_unknown_0::MaybeNumberString(__return_storage_ptr__,field_00,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      break;
    case CPPTYPE_UINT32:
      uVar3 = FieldDescriptor::default_value_uint32(local_18);
      SimpleItoa_abi_cxx11_(&local_70,(protobuf *)(ulong)uVar3,i_00);
      anon_unknown_0::MaybeNumberString(__return_storage_ptr__,field_00,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      break;
    case CPPTYPE_UINT64:
      ppVar6 = (protobuf *)FieldDescriptor::default_value_uint64(local_18);
      SimpleItoa_abi_cxx11_(&local_b0,ppVar6,i_03);
      anon_unknown_0::MaybeNumberString(__return_storage_ptr__,field_00,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      break;
    case CPPTYPE_DOUBLE:
      value_00 = FieldDescriptor::default_value_double(local_18);
      DoubleToString_abi_cxx11_(__return_storage_ptr__,this,value_00);
      break;
    case CPPTYPE_FLOAT:
      value = FieldDescriptor::default_value_float(local_18);
      FloatToString_abi_cxx11_(__return_storage_ptr__,this,value);
      break;
    case CPPTYPE_BOOL:
      bVar1 = FieldDescriptor::default_value_bool(local_18);
      pcVar7 = "false";
      if (bVar1) {
        pcVar7 = "true";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,pcVar7,
                 (allocator *)(out.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(out.field_2._M_local_buf + 0xf));
      break;
    case CPPTYPE_ENUM:
      this_00 = FieldDescriptor::default_value_enum(local_18);
      uVar4 = EnumValueDescriptor::number(this_00);
      SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)uVar4,i_01);
      break;
    case CPPTYPE_STRING:
      TVar5 = FieldDescriptor::type(local_18);
      if (TVar5 == TYPE_STRING) {
        std::__cxx11::string::string((string *)local_d8);
        psVar8 = FieldDescriptor::default_value_string_abi_cxx11_(local_18);
        local_d9 = anon_unknown_0::EscapeJSString(psVar8,(string *)local_d8);
        if (!(bool)local_d9) {
          internal::LogMessage::LogMessage
                    (&local_118,LOGLEVEL_WARNING,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                     ,799);
          pLVar9 = internal::LogMessage::operator<<(&local_118,"The default value for field ");
          psVar8 = FieldDescriptor::full_name_abi_cxx11_(local_18);
          pLVar9 = internal::LogMessage::operator<<(pLVar9,psVar8);
          pLVar9 = internal::LogMessage::operator<<
                             (pLVar9,
                              " was truncated since it contained invalid UTF-8 or codepoints outside the basic multilingual plane."
                             );
          internal::LogFinisher::operator=(&local_119,pLVar9);
          internal::LogMessage::~LogMessage(&local_118);
        }
        std::operator+(&local_140,"\"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                      );
        std::operator+(__return_storage_ptr__,&local_140,"\"");
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)local_d8);
      }
      else {
        psVar8 = FieldDescriptor::default_value_string_abi_cxx11_(local_18);
        anon_unknown_0::EscapeBase64(&local_180,psVar8);
        std::operator+(&local_160,"\"",&local_180);
        std::operator+(__return_storage_ptr__,&local_160,"\"");
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_180);
      }
      break;
    case CPPTYPE_MESSAGE:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"null",&local_181);
      std::allocator<char>::~allocator((allocator<char> *)&local_181);
      break;
    default:
      internal::LogMessage::LogMessage
                (&local_1c0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                 ,0x32a);
      pLVar9 = internal::LogMessage::operator<<(&local_1c0,"Shouldn\'t reach here.");
      internal::LogFinisher::operator=(&local_1c1,pLVar9);
      internal::LogMessage::~LogMessage(&local_1c0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_1c2);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string JSFieldDefault(const FieldDescriptor* field) {
  if (field->is_repeated()) {
    return "[]";
  }

  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return MaybeNumberString(
          field, SimpleItoa(field->default_value_int32()));
    case FieldDescriptor::CPPTYPE_UINT32:
      // The original codegen is in Java, and Java protobufs store unsigned
      // integer values as signed integer values. In order to exactly match the
      // output, we need to reinterpret as base-2 signed. Ugh.
      return MaybeNumberString(
          field, SimpleItoa(static_cast<int32>(field->default_value_uint32())));
    case FieldDescriptor::CPPTYPE_INT64:
      return MaybeNumberString(
          field, SimpleItoa(field->default_value_int64()));
    case FieldDescriptor::CPPTYPE_UINT64:
      // See above note for uint32 -- reinterpreting as signed.
      return MaybeNumberString(
          field, SimpleItoa(static_cast<int64>(field->default_value_uint64())));
    case FieldDescriptor::CPPTYPE_ENUM:
      return SimpleItoa(field->default_value_enum()->number());
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_FLOAT:
      return FloatToString(field->default_value_float());
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return DoubleToString(field->default_value_double());
    case FieldDescriptor::CPPTYPE_STRING:
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        string out;
        bool is_valid = EscapeJSString(field->default_value_string(), &out);
        if (!is_valid) {
          // TODO(lukestebbing): Decide whether this should be a hard error.
          GOOGLE_LOG(WARNING) << "The default value for field " << field->full_name()
                       << " was truncated since it contained invalid UTF-8 or"
                          " codepoints outside the basic multilingual plane.";
        }
        return "\"" + out + "\"";
      } else {  // Bytes
        return "\"" + EscapeBase64(field->default_value_string()) + "\"";
      }
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "null";
  }
  GOOGLE_LOG(FATAL) << "Shouldn't reach here.";
  return "";
}